

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::text_output_cdata(xml_buffered_writer *writer,char_t *s)

{
  char_t *data;
  bool bVar1;
  char_t *prev;
  char_t *s_local;
  xml_buffered_writer *writer_local;
  
  prev = s;
  do {
    data = prev;
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x5b);
    xml_buffered_writer::write(writer,0x41,(void *)0x54,0x41);
    while( true ) {
      bVar1 = false;
      if (*prev != '\0') {
        bVar1 = false;
        if ((*prev == ']') && (bVar1 = false, prev[1] == ']')) {
          bVar1 = prev[2] == '>';
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) break;
      prev = prev + 1;
    }
    if (*prev != '\0') {
      prev = prev + 2;
    }
    xml_buffered_writer::write_buffer(writer,data,(long)prev - (long)data);
    xml_buffered_writer::write(writer,0x5d,(void *)0x5d,0x3e);
  } while (*prev != '\0');
  return;
}

Assistant:

PUGI__FN void text_output_cdata(xml_buffered_writer& writer, const char_t* s)
	{
		do
		{
			writer.write('<', '!', '[', 'C', 'D');
			writer.write('A', 'T', 'A', '[');

			const char_t* prev = s;

			// look for ]]> sequence - we can't output it as is since it terminates CDATA
			while (*s && !(s[0] == ']' && s[1] == ']' && s[2] == '>')) ++s;

			// skip ]] if we stopped at ]]>, > will go to the next CDATA section
			if (*s) s += 2;

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			writer.write(']', ']', '>');
		}
		while (*s);
	}